

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiColumnsSet::Clear(ImGuiColumnsSet *this)

{
  ImGuiColumnsSet *this_local;
  
  this->ID = 0;
  this->Flags = 0;
  this->IsFirstFrame = false;
  this->IsBeingResized = false;
  this->Current = 0;
  this->Count = 1;
  this->MaxX = 0.0;
  this->MinX = 0.0;
  this->LineMaxY = 0.0;
  this->LineMinY = 0.0;
  this->StartPosY = 0.0;
  this->StartMaxPosX = 0.0;
  ImVector<ImGuiColumnData>::clear(&this->Columns);
  return;
}

Assistant:

void Clear()
    {
        ID = 0;
        Flags = 0;
        IsFirstFrame = false;
        IsBeingResized = false;
        Current = 0;
        Count = 1;
        MinX = MaxX = 0.0f;
        LineMinY = LineMaxY = 0.0f;
        StartPosY = 0.0f;
        StartMaxPosX = 0.0f;
        Columns.clear();
    }